

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_ARB1_ENDIF(Context *ctx)

{
  uint uVar1;
  char endbranch [32];
  char acStack_38 [40];
  
  if (ctx->profile_supports_nv4 != 0) {
LAB_00116c31:
    output_line(ctx,"ENDIF;");
    return;
  }
  if (ctx->profile_supports_nv2 != 0) {
    if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) goto LAB_00116c31;
    if (ctx->profile_supports_nv2 != 0) {
      if (0 < ctx->branch_labels_stack_index) {
        uVar1 = ctx->branch_labels_stack_index - 1;
        ctx->branch_labels_stack_index = uVar1;
        snprintf(acStack_38,0x20,"branch_label%d",(ulong)(uint)ctx->branch_labels_stack[uVar1]);
        output_line(ctx,"%s:",acStack_38);
        return;
      }
      __assert_fail("ctx->branch_labels_stack_index > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x1eed,"void emit_ARB1_ENDIF(Context *)");
    }
  }
  failf(ctx,"branching unsupported in %s profile",ctx->profile->name);
  return;
}

Assistant:

static void emit_ARB1_ENDIF(Context *ctx)
{
    // nv2 fragment programs (and everything nv4) have a real ENDIF.
    if ( (support_nv4(ctx)) || ((support_nv2(ctx)) && (shader_is_pixel(ctx))) )
        output_line(ctx, "ENDIF;");

    else if (support_nv2(ctx))
    {
        // there's no ENDIF construct, but we can use a branch to a label.
        assert(ctx->branch_labels_stack_index > 0);
        const int endlabel = ctx->branch_labels_stack[--ctx->branch_labels_stack_index];
        char endbranch[32];
        get_ARB1_branch_label_name(ctx,endlabel,endbranch,sizeof (endbranch));
        output_line(ctx, "%s:", endbranch);
    } // if

    else  // stock ARB1 has no branching.
    {
        failf(ctx, "branching unsupported in %s profile", ctx->profile->name);
    } // else
}